

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptelement.cpp
# Opt level: O1

void __thiscall
ScriptElement_CopyConstructor_Test::TestBody(ScriptElement_CopyConstructor_Test *this)

{
  undefined8 lhs;
  bool bVar1;
  ScriptElementType SVar2;
  ScriptOperator *lhs_00;
  ScriptOperator *rhs;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_2;
  ScriptElement copied_elem;
  ScriptElement op_elem;
  string local_148;
  undefined1 local_128 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  internal local_f0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  ByteData local_e0;
  ScriptElement local_c8;
  ScriptElement local_68;
  
  cfd::core::ScriptElement::ScriptElement
            (&local_68,(ScriptOperator *)cfd::core::ScriptOperator::OP_DUP);
  cfd::core::ScriptElement::ScriptElement(&local_c8,&local_68);
  local_148._M_dataplus._M_p._0_4_ = cfd::core::ScriptElement::GetType(&local_68);
  SVar2 = cfd::core::ScriptElement::GetType(&local_c8);
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,SVar2);
  testing::internal::CmpHelperEQ<cfd::core::ScriptElementType,cfd::core::ScriptElementType>
            ((internal *)local_128,"op_elem.GetType()","copied_elem.GetType()",
             (ScriptElementType *)&local_148,(ScriptElementType *)&local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if ((pointer)local_128._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((long *)local_148._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_148._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_148._M_dataplus._M_p + 8))();
      }
      local_148._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_128 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  lhs_00 = cfd::core::ScriptElement::GetOpCode(&local_68);
  rhs = cfd::core::ScriptElement::GetOpCode(&local_c8);
  testing::internal::CmpHelperEQ<cfd::core::ScriptOperator,cfd::core::ScriptOperator>
            ((internal *)local_128,"op_elem.GetOpCode()","copied_elem.GetOpCode()",lhs_00,rhs);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if ((pointer)local_128._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((long *)local_148._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_148._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_148._M_dataplus._M_p + 8))();
      }
      local_148._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_128 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ScriptElement::GetBinaryData((ByteData *)&local_148,&local_68);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,
             (ByteData *)&local_148);
  cfd::core::ScriptElement::GetBinaryData(&local_e0,&local_c8);
  cfd::core::ByteData::GetBytes(&local_108,&local_e0);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (local_f0,"op_elem.GetBinaryData().GetBytes()","copied_elem.GetBinaryData().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,&local_108);
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((long *)local_148._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_148._M_dataplus._M_p = (pointer)cfd::core::ScriptElement::GetNumber(&local_68);
  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::core::ScriptElement::GetNumber(&local_c8);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_128,"op_elem.GetNumber()","copied_elem.GetNumber()",
             (long *)&local_148,(long *)&local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_148);
    if ((pointer)local_128._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_128._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((long *)local_148._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_148._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_148._M_dataplus._M_p + 8))();
      }
      local_148._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_128 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ScriptElement::GetData((ByteData *)&local_148,&local_68);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,
             (ByteData *)&local_148);
  cfd::core::ScriptElement::GetData(&local_e0,&local_c8);
  cfd::core::ByteData::GetBytes(&local_108,&local_e0);
  testing::internal::
  CmpHelperEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (local_f0,"op_elem.GetData().GetBytes()","copied_elem.GetData().GetBytes()",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,&local_108);
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((long *)local_148._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_e8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_e8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptElement::ToString_abi_cxx11_((string *)local_128,&local_68);
  lhs = local_128._0_8_;
  cfd::core::ScriptElement::ToString_abi_cxx11_(&local_148,&local_c8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_108,"op_elem.ToString().c_str()","copied_elem.ToString().c_str()",
             (char *)lhs,local_148._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_128 + 0x10))
  {
    operator_delete((void *)local_128._0_8_);
  }
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_128);
    if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptelement.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_128._0_8_ + 8))();
      }
      local_128._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ScriptElement::~ScriptElement(&local_c8);
  cfd::core::ScriptElement::~ScriptElement(&local_68);
  return;
}

Assistant:

TEST(ScriptElement, CopyConstructor) {
  ScriptElement op_elem = ScriptElement(ScriptOperator::OP_DUP);
  ScriptElement copied_elem = ScriptElement(op_elem);

  EXPECT_EQ(op_elem.GetType(), copied_elem.GetType());
  EXPECT_EQ(op_elem.GetOpCode(), copied_elem.GetOpCode());
  EXPECT_EQ(op_elem.GetBinaryData().GetBytes(),
            copied_elem.GetBinaryData().GetBytes());
  EXPECT_EQ(op_elem.GetNumber(), copied_elem.GetNumber());
  EXPECT_EQ(op_elem.GetData().GetBytes(), copied_elem.GetData().GetBytes());
  EXPECT_STREQ(op_elem.ToString().c_str(), copied_elem.ToString().c_str());
}